

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cpp
# Opt level: O0

uint8_t getBoardStatus(TBoard *board)

{
  int iVar1;
  const_reference pvVar2;
  int j;
  int i_1;
  int i;
  size_type in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  value_type_conflict3 in_stack_ffffffffffffffc4;
  int local_1c;
  int local_18;
  int local_14;
  uint8_t local_1;
  
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    std::array<std::array<int,_3UL>,_3UL>::operator[]
              ((array<std::array<int,_3UL>,_3UL> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
    pvVar2 = std::array<int,_3UL>::operator[]
                       ((array<int,_3UL> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8);
    iVar1 = *pvVar2;
    std::array<std::array<int,_3UL>,_3UL>::operator[]
              ((array<std::array<int,_3UL>,_3UL> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
    pvVar2 = std::array<int,_3UL>::operator[]
                       ((array<int,_3UL> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8);
    if (iVar1 == *pvVar2) {
      std::array<std::array<int,_3UL>,_3UL>::operator[]
                ((array<std::array<int,_3UL>,_3UL> *)
                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffb8);
      pvVar2 = std::array<int,_3UL>::operator[]
                         ((array<int,_3UL> *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffb8);
      iVar1 = *pvVar2;
      std::array<std::array<int,_3UL>,_3UL>::operator[]
                ((array<std::array<int,_3UL>,_3UL> *)
                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffb8);
      pvVar2 = std::array<int,_3UL>::operator[]
                         ((array<int,_3UL> *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffb8);
      if (iVar1 == *pvVar2) {
        std::array<std::array<int,_3UL>,_3UL>::operator[]
                  ((array<std::array<int,_3UL>,_3UL> *)
                   CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8);
        pvVar2 = std::array<int,_3UL>::operator[]
                           ((array<int,_3UL> *)
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            in_stack_ffffffffffffffb8);
        if (*pvVar2 != 0) {
          std::array<std::array<int,_3UL>,_3UL>::operator[]
                    ((array<std::array<int,_3UL>,_3UL> *)
                     CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffb8);
          pvVar2 = std::array<int,_3UL>::operator[]
                             ((array<int,_3UL> *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                              in_stack_ffffffffffffffb8);
          if (*pvVar2 != 1) {
            return '\x02';
          }
          return '\x01';
        }
      }
    }
    std::array<std::array<int,_3UL>,_3UL>::operator[]
              ((array<std::array<int,_3UL>,_3UL> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
    pvVar2 = std::array<int,_3UL>::operator[]
                       ((array<int,_3UL> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8);
    iVar1 = *pvVar2;
    std::array<std::array<int,_3UL>,_3UL>::operator[]
              ((array<std::array<int,_3UL>,_3UL> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
    pvVar2 = std::array<int,_3UL>::operator[]
                       ((array<int,_3UL> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8);
    if (iVar1 == *pvVar2) {
      std::array<std::array<int,_3UL>,_3UL>::operator[]
                ((array<std::array<int,_3UL>,_3UL> *)
                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffb8);
      pvVar2 = std::array<int,_3UL>::operator[]
                         ((array<int,_3UL> *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffb8);
      iVar1 = *pvVar2;
      std::array<std::array<int,_3UL>,_3UL>::operator[]
                ((array<std::array<int,_3UL>,_3UL> *)
                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffb8);
      pvVar2 = std::array<int,_3UL>::operator[]
                         ((array<int,_3UL> *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffb8);
      if (iVar1 == *pvVar2) {
        std::array<std::array<int,_3UL>,_3UL>::operator[]
                  ((array<std::array<int,_3UL>,_3UL> *)
                   CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8);
        pvVar2 = std::array<int,_3UL>::operator[]
                           ((array<int,_3UL> *)
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            in_stack_ffffffffffffffb8);
        if (*pvVar2 != 0) {
          std::array<std::array<int,_3UL>,_3UL>::operator[]
                    ((array<std::array<int,_3UL>,_3UL> *)
                     CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffb8);
          pvVar2 = std::array<int,_3UL>::operator[]
                             ((array<int,_3UL> *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                              in_stack_ffffffffffffffb8);
          if (*pvVar2 != 1) {
            return '\x02';
          }
          return '\x01';
        }
      }
    }
  }
  std::array<std::array<int,_3UL>,_3UL>::operator[]
            ((array<std::array<int,_3UL>,_3UL> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8
            );
  pvVar2 = std::array<int,_3UL>::operator[]
                     ((array<int,_3UL> *)
                      CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffb8);
  iVar1 = *pvVar2;
  std::array<std::array<int,_3UL>,_3UL>::operator[]
            ((array<std::array<int,_3UL>,_3UL> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8
            );
  pvVar2 = std::array<int,_3UL>::operator[]
                     ((array<int,_3UL> *)
                      CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffb8);
  if (iVar1 == *pvVar2) {
    std::array<std::array<int,_3UL>,_3UL>::operator[]
              ((array<std::array<int,_3UL>,_3UL> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
    pvVar2 = std::array<int,_3UL>::operator[]
                       ((array<int,_3UL> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8);
    iVar1 = *pvVar2;
    std::array<std::array<int,_3UL>,_3UL>::operator[]
              ((array<std::array<int,_3UL>,_3UL> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
    pvVar2 = std::array<int,_3UL>::operator[]
                       ((array<int,_3UL> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8);
    if (iVar1 != *pvVar2) goto LAB_002455dd;
    std::array<std::array<int,_3UL>,_3UL>::operator[]
              ((array<std::array<int,_3UL>,_3UL> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
    pvVar2 = std::array<int,_3UL>::operator[]
                       ((array<int,_3UL> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8);
    if (*pvVar2 == 0) goto LAB_002455dd;
LAB_00245692:
    std::array<std::array<int,_3UL>,_3UL>::operator[]
              ((array<std::array<int,_3UL>,_3UL> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
    pvVar2 = std::array<int,_3UL>::operator[]
                       ((array<int,_3UL> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8);
    local_1 = '\x02';
    if (*pvVar2 == 1) {
      local_1 = '\x01';
    }
  }
  else {
LAB_002455dd:
    std::array<std::array<int,_3UL>,_3UL>::operator[]
              ((array<std::array<int,_3UL>,_3UL> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
    pvVar2 = std::array<int,_3UL>::operator[]
                       ((array<int,_3UL> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8);
    iVar1 = *pvVar2;
    std::array<std::array<int,_3UL>,_3UL>::operator[]
              ((array<std::array<int,_3UL>,_3UL> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
    pvVar2 = std::array<int,_3UL>::operator[]
                       ((array<int,_3UL> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8);
    if (iVar1 == *pvVar2) {
      std::array<std::array<int,_3UL>,_3UL>::operator[]
                ((array<std::array<int,_3UL>,_3UL> *)
                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffb8);
      pvVar2 = std::array<int,_3UL>::operator[]
                         ((array<int,_3UL> *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffb8);
      in_stack_ffffffffffffffc4 = *pvVar2;
      std::array<std::array<int,_3UL>,_3UL>::operator[]
                ((array<std::array<int,_3UL>,_3UL> *)
                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffb8);
      pvVar2 = std::array<int,_3UL>::operator[]
                         ((array<int,_3UL> *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffb8);
      if (in_stack_ffffffffffffffc4 == *pvVar2) {
        std::array<std::array<int,_3UL>,_3UL>::operator[]
                  ((array<std::array<int,_3UL>,_3UL> *)
                   CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8);
        pvVar2 = std::array<int,_3UL>::operator[]
                           ((array<int,_3UL> *)
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            in_stack_ffffffffffffffb8);
        if (*pvVar2 != 0) goto LAB_00245692;
      }
    }
    for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
      for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
        std::array<std::array<int,_3UL>,_3UL>::operator[]
                  ((array<std::array<int,_3UL>,_3UL> *)
                   CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8);
        pvVar2 = std::array<int,_3UL>::operator[]
                           ((array<int,_3UL> *)
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            in_stack_ffffffffffffffb8);
        if (*pvVar2 == 0) {
          return '\0';
        }
      }
    }
    local_1 = '\x03';
  }
  return local_1;
}

Assistant:

static uint8_t
getBoardStatus(const TBoard &board)
{
    for (int i = 0; i < 3; i++)
    {
        if (board[i][1] == board[i][0] && board[i][1] == board[i][2] && board[i][1] != 0)
            return (board[i][1] == 1 ? 1 : 2);
        if (board[1][i] == board[0][i] && board[1][i] == board[2][i] && board[1][i] != 0)
            return (board[1][i] == 1 ? 1 : 2);
    }
    if ((board[1][1] == board[0][0] && board[1][1] == board[2][2] && board[1][1] != 0) ||
        (board[1][1] == board[2][0] && board[1][1] == board[0][2] && board[1][1] != 0))
        return (board[1][1] == 1 ? 1 : 2);
    for (int i = 0; i < 3; i++)
        for (int j = 0; j < 3; j++)
            if (board[i][j] == 0)
                return 0;
    return 3;
}